

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

int mbedtls_base64_decode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  uchar uVar1;
  byte c;
  long lVar2;
  char cVar3;
  ulong uVar4;
  uchar c_00;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  uchar *puVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (slen == 0) {
    sVar7 = 0;
    iVar9 = 0;
  }
  else {
    uVar4 = 0;
    uVar11 = 0;
    uVar13 = 0;
    do {
      uVar6 = uVar13 + 1;
      if (uVar13 + 1 < slen) {
        uVar6 = slen;
      }
      uVar1 = src[uVar13];
      uVar12 = uVar13;
      if (uVar1 == ' ') {
        do {
          uVar12 = uVar6;
          if (uVar6 - 1 == uVar13) break;
          uVar12 = uVar13 + 1;
          lVar2 = uVar13 + 1;
          uVar13 = uVar12;
        } while (src[lVar2] == ' ');
      }
      uVar13 = slen;
      if (slen == uVar12) break;
      c_00 = src[uVar12];
      uVar5 = (uint)uVar4;
      if (c_00 == '\r' && 1 < slen - uVar12) {
        if (src[uVar12 + 1] != '\n') {
          c_00 = '\r';
          if (uVar1 == ' ') {
            return -0x2c;
          }
LAB_0021e2a7:
          if (uVar5 != 0) {
            return -0x2c;
          }
          cVar3 = mbedtls_ct_base64_dec_value(c_00);
          uVar4 = 0;
          if (cVar3 < '\0') {
            return -0x2c;
          }
LAB_0021e2c7:
          uVar11 = uVar11 + 1;
        }
      }
      else if (c_00 != '\n') {
        if (uVar1 == ' ') {
          return -0x2c;
        }
        if ((char)c_00 < '\0') {
          return -0x2c;
        }
        if (c_00 != '=') goto LAB_0021e2a7;
        if (1 < uVar5) {
          return -0x2c;
        }
        uVar4 = (ulong)(uVar5 + 1);
        goto LAB_0021e2c7;
      }
      uVar13 = uVar12 + 1;
    } while (uVar13 < slen);
    iVar9 = 0;
    if (uVar11 == 0) {
      sVar7 = 0;
    }
    else {
      sVar7 = (ulong)(((uint)uVar11 & 7) * 6 + 7 >> 3) +
              ((uVar11 >> 2 & 0xfffffffffffffffe) * 3 - uVar4);
      iVar9 = -0x2a;
      if ((dst != (uchar *)0x0) && (sVar7 <= dlen)) {
        puVar8 = dst;
        if (uVar13 != 0) {
          sVar7 = 0;
          uVar10 = 0;
          iVar9 = 0;
          uVar5 = 0;
          do {
            c = src[sVar7];
            if ((0x20 < (ulong)c) || ((0x100002400U >> ((ulong)c & 0x3f) & 1) == 0)) {
              uVar5 = uVar5 << 6;
              if (c == 0x3d) {
                uVar10 = uVar10 + 1;
              }
              else {
                cVar3 = mbedtls_ct_base64_dec_value(c);
                uVar5 = uVar5 | (int)cVar3;
              }
              iVar9 = iVar9 + 1;
              if (iVar9 == 4) {
                *puVar8 = (uchar)(uVar5 >> 0x10);
                iVar9 = 0;
                if (uVar10 < 2) {
                  puVar8[1] = (uchar)(uVar5 >> 8);
                  if (uVar10 == 0) {
                    puVar8[2] = (uchar)uVar5;
                    puVar8 = puVar8 + 3;
                    iVar9 = 0;
                    uVar10 = 0;
                  }
                  else {
                    puVar8 = puVar8 + 2;
                    uVar10 = 1;
                    iVar9 = 0;
                  }
                }
                else {
                  puVar8 = puVar8 + 1;
                }
              }
            }
            sVar7 = sVar7 + 1;
          } while (uVar13 != sVar7);
        }
        sVar7 = (long)puVar8 - (long)dst;
        iVar9 = 0;
      }
    }
  }
  *olen = sVar7;
  return iVar9;
}

Assistant:

int mbedtls_base64_decode(unsigned char *dst, size_t dlen, size_t *olen,
                          const unsigned char *src, size_t slen)
{
    size_t i; /* index in source */
    size_t n; /* number of digits or trailing = in source */
    uint32_t x; /* value accumulator */
    unsigned accumulated_digits = 0;
    unsigned equals = 0;
    int spaces_present = 0;
    unsigned char *p;

    /* First pass: check for validity and get output length */
    for (i = n = 0; i < slen; i++) {
        /* Skip spaces before checking for EOL */
        spaces_present = 0;
        while (i < slen && src[i] == ' ') {
            ++i;
            spaces_present = 1;
        }

        /* Spaces at end of buffer are OK */
        if (i == slen) {
            break;
        }

        if ((slen - i) >= 2 &&
            src[i] == '\r' && src[i + 1] == '\n') {
            continue;
        }

        if (src[i] == '\n') {
            continue;
        }

        /* Space inside a line is an error */
        if (spaces_present) {
            return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
        }

        if (src[i] > 127) {
            return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
        }

        if (src[i] == '=') {
            if (++equals > 2) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
        } else {
            if (equals != 0) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
            if (mbedtls_ct_base64_dec_value(src[i]) < 0) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
        }
        n++;
    }

    if (n == 0) {
        *olen = 0;
        return 0;
    }

    /* The following expression is to calculate the following formula without
     * risk of integer overflow in n:
     *     n = ( ( n * 6 ) + 7 ) >> 3;
     */
    n = (6 * (n >> 3)) + ((6 * (n & 0x7) + 7) >> 3);
    n -= equals;

    if (dst == NULL || dlen < n) {
        *olen = n;
        return MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL;
    }

    equals = 0;
    for (x = 0, p = dst; i > 0; i--, src++) {
        if (*src == '\r' || *src == '\n' || *src == ' ') {
            continue;
        }

        x = x << 6;
        if (*src == '=') {
            ++equals;
        } else {
            x |= mbedtls_ct_base64_dec_value(*src);
        }

        if (++accumulated_digits == 4) {
            accumulated_digits = 0;
            *p++ = MBEDTLS_BYTE_2(x);
            if (equals <= 1) {
                *p++ = MBEDTLS_BYTE_1(x);
            }
            if (equals <= 0) {
                *p++ = MBEDTLS_BYTE_0(x);
            }
        }
    }

    *olen = p - dst;

    return 0;
}